

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

string * __thiscall
filesystem::path::str_abi_cxx11_(string *__return_storage_ptr__,path *this,path_type type)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong local_1b0;
  size_t i;
  ostringstream local_198 [8];
  ostringstream oss;
  path_type type_local;
  path *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  if ((this->m_type == native_path) && ((this->m_absolute & 1U) != 0)) {
    std::operator<<((ostream *)local_198,"/");
  }
  for (local_1b0 = 0;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->m_path), local_1b0 < sVar1; local_1b0 = local_1b0 + 1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_path,local_1b0);
    std::operator<<((ostream *)local_198,(string *)pvVar2);
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->m_path);
    if (local_1b0 + 1 < sVar1) {
      if (type == native_path) {
        std::operator<<((ostream *)local_198,'/');
      }
      else {
        std::operator<<((ostream *)local_198,'\\');
      }
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string str(path_type type = native_path) const {
        std::ostringstream oss;

        if (m_type == posix_path && m_absolute)
            oss << "/";

        for (size_t i=0; i<m_path.size(); ++i) {
            oss << m_path[i];
            if (i+1 < m_path.size()) {
                if (type == posix_path)
                    oss << '/';
                else
                    oss << '\\';
            }
        }

        return oss.str();
    }